

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddCustomCommandOldStyle
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *depends,string *source,cmCustomCommandLines *commandLines,char *comment)

{
  size_t __n;
  pointer pcVar1;
  pointer pbVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var3;
  pointer this_00;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  cmCustomCommand *pcVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __single_object cc;
  __single_object cc1;
  anon_class_40_2_eb7b3414 addRuleFileToTarget;
  RegularExpression sourceFiles;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_388;
  allocator_type local_379;
  cmMakefile *local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_358;
  _Any_data local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_330;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_328;
  string local_320;
  string local_300;
  string local_2e0;
  pointer local_2c0;
  undefined1 local_2b8 [8];
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  RegularExpression local_260;
  
  local_378 = this;
  std::make_unique<cmCustomCommand>();
  _Var3._M_head_impl = local_388._M_head_impl;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,depends);
  cmCustomCommand::SetDepends(_Var3._M_head_impl,&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  _Var3._M_head_impl = local_388._M_head_impl;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_290,
             &commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
  ;
  cmCustomCommand::SetCommandLines(_Var3._M_head_impl,(cmCustomCommandLines *)&local_290);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_290);
  cmCustomCommand::SetComment(local_388._M_head_impl,comment);
  __n = source->_M_string_length;
  if ((__n == target->_M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp((source->_M_dataplus)._M_p,(target->_M_dataplus)._M_p,__n), iVar5 == 0)))) {
    local_328._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         local_388._M_head_impl;
    local_388._M_head_impl = (cmCustomCommand *)0x0;
    AddCustomCommandToTarget(local_378,target,POST_BUILD,&local_328);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_328)
    ;
  }
  else {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(local_378->Targets)._M_h,target);
    local_2b8 = (undefined1  [8])
                ((long)iVar6.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 0x28);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_2b8 = (undefined1  [8])0x0;
    }
    local_2b0._M_p = (pointer)&local_2a0;
    pcVar1 = (target->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar1,pcVar1 + target->_M_string_length);
    local_260.regmust = (char *)0x0;
    local_260.program = (char *)0x0;
    local_260.progsize = 0;
    memset(&local_260,0,0x20a);
    cmsys::RegularExpression::compile
              (&local_260,
               "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|mpp|ixx|cppm|ccm|cxxm|c\\+\\+m|cu|m|mm|rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|hm|hpp|hxx|in|txx|inl)$"
              );
    bVar4 = cmsys::RegularExpression::find
                      (&local_260,(source->_M_dataplus)._M_p,&local_260.regmatch);
    _Var3._M_head_impl = local_388._M_head_impl;
    if (bVar4) {
      pbVar8 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != pbVar2) {
        do {
          _Var3._M_head_impl = local_388._M_head_impl;
          pcVar7 = (cmCustomCommand *)operator_new(0x140);
          cmCustomCommand::cmCustomCommand(pcVar7,_Var3._M_head_impl);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          pcVar1 = (pbVar8->_M_dataplus)._M_p;
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_300,pcVar1,pcVar1 + pbVar8->_M_string_length);
          cmCustomCommand::SetOutputs(pcVar7,&local_300);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_370.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_320,pcVar1,pcVar1 + source->_M_string_length);
          cmCustomCommand::SetMainDependency((cmCustomCommand *)this_00,&local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
          }
          local_358._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_370.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::function<void(cmSourceFile*)>::
          function<cmMakefile::AddCustomCommandOldStyle(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmCustomCommandLines_const&,char_const*)::__0&,void>
                    ((function<void(cmSourceFile*)> *)local_350._M_pod_data,
                     (anon_class_40_2_eb7b3414 *)local_2b8);
          AddCustomCommandToOutput
                    (local_378,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_358,(CommandSourceCallback *)&local_350,false);
          if ((code *)local_340._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_340._M_allocated_capacity)(&local_350,&local_350,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_358);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_370);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar2);
      }
    }
    else {
      pcVar1 = (source->_M_dataplus)._M_p;
      local_350._M_unused._M_object = &local_340;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_350,pcVar1,pcVar1 + source->_M_string_length);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_350;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_370,__l,&local_379);
      cmCustomCommand::AppendDepends(_Var3._M_head_impl,&local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_unused._0_8_ != &local_340) {
        operator_delete(local_350._M_unused._M_object,(ulong)(local_340._M_allocated_capacity + 1));
      }
      pbVar8 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2c0 = (outputs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != local_2c0) {
        do {
          _Var3._M_head_impl = local_388._M_head_impl;
          pcVar7 = (cmCustomCommand *)operator_new(0x140);
          cmCustomCommand::cmCustomCommand(pcVar7,_Var3._M_head_impl);
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          pcVar1 = (pbVar8->_M_dataplus)._M_p;
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0,pcVar1,pcVar1 + pbVar8->_M_string_length);
          cmCustomCommand::SetOutputs(pcVar7,&local_2e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          local_330._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_370.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_370.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::function<void(cmSourceFile*)>::
          function<cmMakefile::AddCustomCommandOldStyle(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmCustomCommandLines_const&,char_const*)::__0&,void>
                    ((function<void(cmSourceFile*)> *)local_350._M_pod_data,
                     (anon_class_40_2_eb7b3414 *)local_2b8);
          AddCustomCommandToOutput
                    (local_378,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_330,(CommandSourceCallback *)&local_350,false);
          if ((code *)local_340._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_340._M_allocated_capacity)(&local_350,&local_350,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_330);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_370);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_2c0);
      }
    }
    if (local_260.program != (char *)0x0) {
      operator_delete__(local_260.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != &local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
  }
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_388);
  return;
}

Assistant:

void cmMakefile::AddCustomCommandOldStyle(
  const std::string& target, const std::vector<std::string>& outputs,
  const std::vector<std::string>& depends, const std::string& source,
  const cmCustomCommandLines& commandLines, const char* comment)
{
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetComment(comment);

  // Translate the old-style signature to one of the new-style
  // signatures.
  if (source == target) {
    // In the old-style signature if the source and target were the
    // same then it added a post-build rule to the target.  Preserve
    // this behavior.
    this->AddCustomCommandToTarget(target, cmCustomCommandType::POST_BUILD,
                                   std::move(cc));
    return;
  }

  auto ti = this->Targets.find(target);
  cmTarget* t = ti != this->Targets.end() ? &ti->second : nullptr;

  auto addRuleFileToTarget = [=](cmSourceFile* sf) {
    // If the rule was added to the source (and not a .rule file),
    // then add the source to the target to make sure the rule is
    // included.
    if (!sf->GetPropertyAsBool("__CMAKE_RULE")) {
      if (t) {
        t->AddSource(sf->ResolveFullPath());
      } else {
        cmSystemTools::Error("Attempt to add a custom rule to a target "
                             "that does not exist yet for target " +
                             target);
      }
    }
  };

  // Each output must get its own copy of this rule.
  cmsys::RegularExpression sourceFiles(
    "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|mpp|ixx|cppm|ccm|cxxm|c\\+\\+m|cu|m|mm|"
    "rc|def|r|odl|idl|hpj|bat|h|h\\+\\+|"
    "hm|hpp|hxx|in|txx|inl)$");

  // Choose whether to use a main dependency.
  if (sourceFiles.find(source)) {
    // The source looks like a real file.  Use it as the main dependency.
    for (std::string const& output : outputs) {
      auto cc1 = cm::make_unique<cmCustomCommand>(*cc);
      cc1->SetOutputs(output);
      cc1->SetMainDependency(source);
      this->AddCustomCommandToOutput(std::move(cc1), addRuleFileToTarget);
    }
  } else {
    cc->AppendDepends({ source });

    // The source may not be a real file.  Do not use a main dependency.
    for (std::string const& output : outputs) {
      auto cc1 = cm::make_unique<cmCustomCommand>(*cc);
      cc1->SetOutputs(output);
      this->AddCustomCommandToOutput(std::move(cc1), addRuleFileToTarget);
    }
  }
}